

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comex.c
# Opt level: O0

int comex_init_args(int *argc,char ***argv)

{
  int iVar1;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int init_flag;
  int rc;
  int local_18 [2];
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  MPI_Initialized(local_18);
  if (local_18[0] == 0) {
    MPI_Init(local_8,local_10);
  }
  iVar1 = comex_init();
  return iVar1;
}

Assistant:

int comex_init_args(int *argc, char ***argv)
{
    int rc;
    int init_flag;
    
    MPI_Initialized(&init_flag);
    
    if(!init_flag)
        MPI_Init(argc, argv);
    
    rc = comex_init();
    return rc;
}